

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xml_parse_result *
pugi::impl::anon_unknown_0::load_file_impl
          (xml_parse_result *__return_storage_ptr__,xml_document_struct *doc,FILE *file,uint options
          ,xml_encoding encoding,char_t **out_buffer)

{
  FILE *doc_00;
  xml_parse_status status;
  xml_encoding encoding_00;
  void *__ptr;
  size_t sVar1;
  size_t size_00;
  xml_encoding real_encoding;
  size_t read_size;
  char *contents;
  size_t max_suffix_size;
  size_t sStack_30;
  xml_parse_status size_status;
  size_t size;
  char_t **out_buffer_local;
  xml_encoding encoding_local;
  uint options_local;
  FILE *file_local;
  xml_document_struct *doc_local;
  
  size = (size_t)out_buffer;
  out_buffer_local._0_4_ = encoding;
  out_buffer_local._4_4_ = options;
  _encoding_local = (FILE *)file;
  file_local = (FILE *)doc;
  if (file == (FILE *)0x0) {
    make_parse_result(__return_storage_ptr__,status_file_not_found,0);
  }
  else {
    sStack_30 = 0;
    status = get_file_size(file,&stack0xffffffffffffffd0);
    if (status == status_ok) {
      __ptr = (void *)(*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                                allocate)(sStack_30 + 1);
      if (__ptr == (void *)0x0) {
        make_parse_result(__return_storage_ptr__,status_out_of_memory,0);
      }
      else {
        sVar1 = fread(__ptr,1,sStack_30,_encoding_local);
        if (sVar1 == sStack_30) {
          encoding_00 = get_buffer_encoding((xml_encoding)out_buffer_local,__ptr,sStack_30);
          doc_00 = file_local;
          size_00 = zero_terminate_buffer(__ptr,sStack_30,encoding_00);
          load_buffer_impl(__return_storage_ptr__,(xml_document_struct *)doc_00,
                           (xml_node_struct *)doc_00,__ptr,size_00,out_buffer_local._4_4_,
                           encoding_00,true,true,(char_t **)size);
        }
        else {
          (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
                    (__ptr);
          make_parse_result(__return_storage_ptr__,status_io_error,0);
        }
      }
    }
    else {
      make_parse_result(__return_storage_ptr__,status,0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

PUGI__FN xml_parse_result load_file_impl(xml_document_struct* doc, FILE* file, unsigned int options, xml_encoding encoding, char_t** out_buffer)
	{
		if (!file) return make_parse_result(status_file_not_found);

		// get file size (can result in I/O errors)
		size_t size = 0;
		xml_parse_status size_status = get_file_size(file, size);
		if (size_status != status_ok) return make_parse_result(size_status);

		size_t max_suffix_size = sizeof(char_t);

		// allocate buffer for the whole file
		char* contents = static_cast<char*>(xml_memory::allocate(size + max_suffix_size));
		if (!contents) return make_parse_result(status_out_of_memory);

		// read file in memory
		size_t read_size = fread(contents, 1, size, file);

		if (read_size != size)
		{
			xml_memory::deallocate(contents);
			return make_parse_result(status_io_error);
		}

		xml_encoding real_encoding = get_buffer_encoding(encoding, contents, size);

		return load_buffer_impl(doc, doc, contents, zero_terminate_buffer(contents, size, real_encoding), options, real_encoding, true, true, out_buffer);
	}